

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O3

LispPTR LCPutIVValue(LispPTR object,LispPTR iv,LispPTR val)

{
  undefined4 *puVar1;
  DLword *pDVar2;
  LispPTR LVar3;
  uint uVar4;
  ulong uVar5;
  int i;
  uint uVar6;
  ulong uVar7;
  
  if (atom_instance == 0) {
    LCinit();
  }
  uVar4 = *(ushort *)((ulong)(object >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  if ((*(uint *)((long)DTDspace + (ulong)uVar4 * 4 + (ulong)(uVar4 << 5)) & 0xfffffff) ==
      atom_instance) {
    if ((object & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)object);
    }
    pDVar2 = Lisp_world;
    uVar4 = *(uint *)(Lisp_world + (ulong)object + 2);
    uVar5 = (ulong)(((uVar4 ^ iv) & 0x3ff) << 4);
    puVar1 = (undefined4 *)((long)&LCIVCache->iNames + uVar5);
    if ((*(uint *)((long)&LCIVCache->iNames + uVar5) == uVar4) && (puVar1[1] == iv)) {
      uVar6 = (uint)*(ushort *)(puVar1 + 2);
LAB_0012d7ca:
      uVar4 = *(uint *)(pDVar2 + (ulong)object + 4);
      uVar5 = (ulong)uVar4;
      if ((uVar4 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar5);
      }
      pDVar2 = Lisp_world;
      uVar7 = (ulong)uVar6;
      uVar4 = *(ushort *)
               ((ulong)(MDStypetbl + (*(uint *)(Lisp_world + uVar5 + uVar7 * 2) >> 9)) ^ 2) & 0x7ff;
      if ((*(uint *)((long)DTDspace + (ulong)uVar4 * 4 + (ulong)(uVar4 << 5)) & 0xfffffff) !=
          atom_annotatedValue) {
        if ((-1 < *(short *)((ulong)(MDStypetbl + (val >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c)) {
          if (*Reclaim_cnt_word == 0) {
            rec_htfind(val,0);
          }
          else {
            htfind(val,0);
          }
        }
        uVar4 = *(uint *)(pDVar2 + uVar5 + uVar7 * 2);
        if ((-1 < *(short *)((ulong)(uVar4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          if (*Reclaim_cnt_word == 0) {
            rec_htfind(uVar4,1);
          }
          else {
            htfind(uVar4,1);
          }
        }
        *(LispPTR *)(pDVar2 + uVar5 + uVar7 * 2) = val;
        return val;
      }
    }
    else if ((*(ushort *)((ulong)(uVar4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
      uVar6 = 0;
      do {
        LVar3 = car(uVar4);
        if (LVar3 == iv) {
          *puVar1 = *(undefined4 *)(pDVar2 + (ulong)object + 2);
          puVar1[1] = iv;
          puVar1[2] = uVar6 | 0xe0000;
          goto LAB_0012d7ca;
        }
        uVar6 = uVar6 + 1;
        uVar4 = cdr(uVar4);
      } while (uVar4 != 0);
    }
  }
  lcfuncall(atom_PutIVValue_LCUFN,3,3);
  return 0xfffffffe;
}

Assistant:

LispPTR LCPutIVValue(LispPTR object, LispPTR iv, LispPTR val) {
  struct LCInstance *objptr;
  LispPTR *valptr;
  int index;

  LC_INIT;
  INSTANCE_OR_PUNT(object, atom_PutIVValue_LCUFN, 3);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  GET_IV_INDEX(objptr, iv, index, goto pnut);
  valptr = &(((LispPTR *)NativeAligned4FromLAddr(objptr->iDescrs))[index]);
  if (!LC_TYPEP(*valptr, atom_annotatedValue)) {
    FRPLPTR((*valptr), val);
    return val;
  }
pnut:
  RETCALL(atom_PutIVValue_LCUFN, 3);
  /*
    return LCPutActiveValue(object,*valptr,val);
  */
}